

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O2

void __thiscall wasm::LazyLocalGraph::computeSetInfluences(LazyLocalGraph *this,LocalSet *set)

{
  size_type sVar1;
  LocalGraphFlower *this_00;
  LocalSet *local_20;
  LocalSet *set_local;
  
  local_20 = set;
  sVar1 = std::
          _Hashtable<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::LocalSet_*const,_std::unordered_set<wasm::LocalGet_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->setInfluences)._M_h,&local_20);
  if (sVar1 == 0) {
    this_00 = (this->flower)._M_t.
              super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
              .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl;
    if (this_00 == (LocalGraphFlower *)0x0) {
      makeFlower(this);
      this_00 = (this->flower)._M_t.
                super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
                .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl;
    }
    LocalGraphFlower::computeSetInfluences(this_00,local_20,&this->setInfluences);
    return;
  }
  __assert_fail("!setInfluences.count(set)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                ,0x2ac,"void wasm::LazyLocalGraph::computeSetInfluences(LocalSet *) const");
}

Assistant:

void LazyLocalGraph::computeSetInfluences(LocalSet* set) const {
  // We must never repeat work.
  assert(!setInfluences.count(set));

  if (!flower) {
    makeFlower();
  }
  flower->computeSetInfluences(set, setInfluences);
}